

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_1::VaryingOutputCountCase::VaryingOutputCountCase
          (VaryingOutputCountCase *this,Context *context,char *name,char *desc,VaryingSource test,
          ShaderInstancingMode mode)

{
  bool *dataAttributeName;
  
  if ((VaryingSource)desc < READ_LAST) {
    dataAttributeName = (bool *)(&PTR_anon_var_dwarf_2064e03_01e47d30)[(ulong)desc & 0xffffffff];
  }
  else {
    dataAttributeName = glcts::fixed_sample_locations_values + 1;
  }
  GeometryShaderRenderTest::GeometryShaderRenderTest
            (&this->super_GeometryShaderRenderTest,context,name,"Output varying number of vertices",
             0,5,dataAttributeName,0);
  (this->super_GeometryShaderRenderTest).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
       = (_func_int **)&PTR__GeometryShaderRenderTest_01e47500;
  this->m_program = (VaryingOutputCountShader *)0x0;
  this->m_test = (VaryingSource)desc;
  this->m_mode = test;
  this->m_maxEmitCount = 0;
  return;
}

Assistant:

VaryingOutputCountCase::VaryingOutputCountCase (Context& context, const char* name, const char* desc, VaryingOutputCountShader::VaryingSource test, ShaderInstancingMode mode)
	: GeometryShaderRenderTest	(context, name, desc, GL_POINTS, GL_TRIANGLE_STRIP, VaryingOutputCountShader::getAttributeName(test))
	, m_program					(DE_NULL)
	, m_test					(test)
	, m_mode					(mode)
	, m_maxEmitCount			(0)
{
	DE_ASSERT(mode < MODE_LAST);
}